

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O1

int hash_insert(HashTable *table,void *key,void *value)

{
  uint32 uVar1;
  HashItem **ppHVar2;
  uint32 uVar3;
  int iVar4;
  HashItem *pHVar5;
  uint uVar6;
  
  uVar3 = (*table->hash)(key,table->data);
  uVar1 = table->table_len;
  if ((table->stackable == 0) && (iVar4 = hash_find(table,key,(void **)0x0), iVar4 != 0)) {
    return 0;
  }
  pHVar5 = (HashItem *)(*table->m)(0x18,table->d);
  if (pHVar5 == (HashItem *)0x0) {
    iVar4 = -1;
  }
  else {
    uVar6 = uVar1 - 1 & uVar3;
    pHVar5->key = key;
    pHVar5->value = value;
    ppHVar2 = table->table;
    pHVar5->next = ppHVar2[uVar6];
    ppHVar2[uVar6] = pHVar5;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int hash_insert(HashTable *table, const void *key, const void *value)
{
    HashItem *item = NULL;
    const uint32 hash = calc_hash(table, key);
    if ( (!table->stackable) && (hash_find(table, key, NULL)) )
        return 0;

    // !!! FIXME: grow and rehash table if it gets too saturated.
    item = (HashItem *) table->m(sizeof (HashItem), table->d);
    if (item == NULL)
        return -1;

    item->key = key;
    item->value = value;
    item->next = table->table[hash];
    table->table[hash] = item;

    return 1;
}